

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel_drawing.cpp
# Opt level: O3

void ncnn::draw_rectangle_c2
               (uchar *pixels,int w,int h,int stride,int rx,int ry,int rw,int rh,uint color,
               int thickness)

{
  int iVar1;
  uint uVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uchar *puVar7;
  uchar uVar8;
  uchar uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int x;
  int iVar13;
  int iVar14;
  
  uVar8 = (uchar)color;
  uVar9 = (uchar)(color >> 8);
  if (thickness == -1) {
    if (0 < rh) {
      lVar3 = (long)ry;
      do {
        if (-1 < lVar3) {
          if (h <= lVar3) {
            return;
          }
          if (0 < rw) {
            uVar6 = rx * 2;
            iVar5 = rx;
            do {
              if (-1 < iVar5) {
                if (w <= iVar5) break;
                pixels[(ulong)uVar6 + lVar3 * stride] = uVar8;
                pixels[(ulong)(uVar6 + 1) + lVar3 * stride] = uVar9;
              }
              iVar5 = iVar5 + 1;
              uVar6 = uVar6 + 2;
            } while (iVar5 < rw + rx);
          }
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 < rh + ry);
    }
  }
  else {
    iVar5 = thickness / 2;
    iVar1 = thickness - iVar5;
    iVar4 = iVar1 + ry;
    if (ry - iVar5 < iVar4) {
      lVar3 = (long)-iVar5 + (long)ry;
      do {
        if (-1 < lVar3) {
          if (h <= lVar3) break;
          if (rx - iVar5 < rw + rx + iVar1) {
            uVar6 = rx * 2 + iVar5 * -2;
            iVar10 = thickness + rw;
            iVar13 = rx - iVar5;
            do {
              if (-1 < iVar13) {
                if (w <= iVar13) break;
                pixels[(ulong)uVar6 + lVar3 * stride] = uVar8;
                pixels[(ulong)(uVar6 + 1) + lVar3 * stride] = uVar9;
              }
              iVar13 = iVar13 + 1;
              uVar6 = uVar6 + 2;
              iVar10 = iVar10 + -1;
            } while (iVar10 != 0);
          }
        }
        lVar3 = lVar3 + 1;
      } while (iVar4 != (int)lVar3);
    }
    iVar14 = iVar1 + ry + rh;
    iVar10 = (ry + rh) - iVar5;
    iVar13 = rx - iVar5;
    if (iVar10 < iVar14) {
      lVar3 = (long)iVar10;
      do {
        if (-1 < lVar3) {
          if (h <= lVar3) break;
          if (iVar13 < rw + rx + iVar1) {
            uVar6 = rx * 2 + iVar5 * -2;
            iVar11 = thickness + rw;
            iVar12 = iVar13;
            do {
              if (-1 < iVar12) {
                if (w <= iVar12) break;
                pixels[(ulong)uVar6 + lVar3 * stride] = uVar8;
                pixels[(ulong)(uVar6 + 1) + lVar3 * stride] = uVar9;
              }
              iVar12 = iVar12 + 1;
              uVar6 = uVar6 + 2;
              iVar11 = iVar11 + -1;
            } while (iVar11 != 0);
          }
        }
        lVar3 = lVar3 + 1;
      } while (iVar14 != (int)lVar3);
    }
    if (iVar13 < iVar1 + rx) {
      uVar2 = rx * 2 + iVar5 * -2;
      uVar6 = uVar2 + 1;
      do {
        if (-1 < iVar13) {
          if (w <= iVar13) break;
          puVar7 = pixels + (long)stride * (long)iVar4;
          lVar3 = (long)iVar4;
          iVar14 = rh - thickness;
          if (iVar4 < iVar10) {
            do {
              if (-1 < lVar3) {
                if (h <= lVar3) break;
                puVar7[uVar2] = uVar8;
                puVar7[uVar6] = uVar9;
              }
              iVar14 = iVar14 + -1;
              puVar7 = puVar7 + stride;
              lVar3 = lVar3 + 1;
            } while (iVar14 != 0);
          }
        }
        iVar13 = iVar13 + 1;
        uVar2 = uVar2 + 2;
        uVar6 = uVar6 + 2;
      } while (iVar13 != iVar1 + rx);
    }
    iVar1 = iVar1 + rw + rx;
    iVar5 = (rw + rx) - iVar5;
    if (iVar5 < iVar1) {
      uVar2 = iVar5 * 2;
      uVar6 = iVar5 * 2 + 1;
      do {
        if (-1 < iVar5) {
          if (w <= iVar5) {
            return;
          }
          lVar3 = (long)iVar4;
          puVar7 = pixels + (long)stride * (long)iVar4;
          iVar13 = rh - thickness;
          if (iVar4 < iVar10) {
            do {
              if (-1 < lVar3) {
                if (h <= lVar3) break;
                puVar7[uVar2] = uVar8;
                puVar7[uVar6] = uVar9;
              }
              iVar13 = iVar13 + -1;
              lVar3 = lVar3 + 1;
              puVar7 = puVar7 + stride;
            } while (iVar13 != 0);
          }
        }
        iVar5 = iVar5 + 1;
        uVar2 = uVar2 + 2;
        uVar6 = uVar6 + 2;
      } while (iVar5 != iVar1);
    }
  }
  return;
}

Assistant:

void draw_rectangle_c2(unsigned char* pixels, int w, int h, int stride, int rx, int ry, int rw, int rh, unsigned int color, int thickness)
{
    const unsigned char* pen_color = (const unsigned char*)&color;

    if (thickness == -1)
    {
        // filled
        for (int y = ry; y < ry + rh; y++)
        {
            if (y < 0)
                continue;

            if (y >= h)
                break;

            unsigned char* p = pixels + stride * y;

            for (int x = rx; x < rx + rw; x++)
            {
                if (x < 0)
                    continue;

                if (x >= w)
                    break;

                p[x * 2 + 0] = pen_color[0];
                p[x * 2 + 1] = pen_color[1];
            }
        }

        return;
    }

    const int t0 = thickness / 2;
    const int t1 = thickness - t0;

    // draw top
    {
        for (int y = ry - t0; y < ry + t1; y++)
        {
            if (y < 0)
                continue;

            if (y >= h)
                break;

            unsigned char* p = pixels + stride * y;

            for (int x = rx - t0; x < rx + rw + t1; x++)
            {
                if (x < 0)
                    continue;

                if (x >= w)
                    break;

                p[x * 2 + 0] = pen_color[0];
                p[x * 2 + 1] = pen_color[1];
            }
        }
    }

    // draw bottom
    {
        for (int y = ry + rh - t0; y < ry + rh + t1; y++)
        {
            if (y < 0)
                continue;

            if (y >= h)
                break;

            unsigned char* p = pixels + stride * y;

            for (int x = rx - t0; x < rx + rw + t1; x++)
            {
                if (x < 0)
                    continue;

                if (x >= w)
                    break;

                p[x * 2 + 0] = pen_color[0];
                p[x * 2 + 1] = pen_color[1];
            }
        }
    }

    // draw left
    for (int x = rx - t0; x < rx + t1; x++)
    {
        if (x < 0)
            continue;

        if (x >= w)
            break;

        for (int y = ry + t1; y < ry + rh - t0; y++)
        {
            if (y < 0)
                continue;

            if (y >= h)
                break;

            unsigned char* p = pixels + stride * y;

            p[x * 2 + 0] = pen_color[0];
            p[x * 2 + 1] = pen_color[1];
        }
    }

    // draw right
    for (int x = rx + rw - t0; x < rx + rw + t1; x++)
    {
        if (x < 0)
            continue;

        if (x >= w)
            break;

        for (int y = ry + t1; y < ry + rh - t0; y++)
        {
            if (y < 0)
                continue;

            if (y >= h)
                break;

            unsigned char* p = pixels + stride * y;

            p[x * 2 + 0] = pen_color[0];
            p[x * 2 + 1] = pen_color[1];
        }
    }
}